

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_BrDeleteNetwork_Test::TestBody
          (InterpreterTestSuite_PC_BrDeleteNetwork_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  char *message;
  AssertHelper local_cb8;
  Message local_cb0;
  int local_ca4;
  size_type local_ca0;
  undefined1 local_c98 [8];
  AssertionResult gtest_ar_5;
  Message local_c80;
  Status local_c72;
  Status local_c71;
  undefined1 local_c70 [8];
  AssertionResult gtest_ar_4;
  BorderRouterArray bra;
  AssertHelper local_c28;
  Message local_c20;
  bool local_c11;
  undefined1 local_c10 [8];
  AssertionResult gtest_ar_;
  allocator local_bb1;
  string local_bb0;
  Expression local_b90;
  undefined1 local_b78 [8];
  Value value;
  Expression expr;
  Message local_b10;
  Status local_b01;
  UnixTime local_b00;
  allocator local_af1;
  string local_af0;
  allocator local_ac9;
  string local_ac8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_aa8;
  allocator local_a81;
  string local_a80;
  Timestamp local_a60;
  allocator local_a51;
  string local_a50;
  allocator local_a29;
  string local_a28;
  allocator local_a01;
  string local_a00;
  State local_9e0;
  allocator local_9d9;
  string local_9d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_9b8;
  allocator local_999;
  string local_998;
  BorderAgent local_978;
  Status local_7f9;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_3;
  Message local_7e0;
  Status local_7d1;
  UnixTime local_7d0;
  allocator local_7c1;
  string local_7c0;
  allocator local_799;
  string local_798;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_778;
  allocator local_751;
  string local_750;
  Timestamp local_730;
  allocator local_721;
  string local_720;
  allocator local_6f9;
  string local_6f8;
  allocator local_6d1;
  string local_6d0;
  State local_6b0;
  allocator local_6a9;
  string local_6a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_688;
  allocator local_669;
  string local_668;
  BorderAgent local_648;
  Status local_4c9;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_2;
  Message local_4b0;
  Status local_4a1;
  UnixTime local_4a0;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_448;
  allocator local_421;
  string local_420;
  Timestamp local_400;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  State local_380;
  allocator local_379;
  string local_378;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_358;
  allocator local_331;
  string local_330;
  BorderAgent local_310;
  Status local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_178;
  Message local_170;
  void *local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_BrDeleteNetwork_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  local_168 = (void *)0x0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)local_160,"ctx.mRegistry","nullptr",
             (Registry **)(ctx.mInterpreter.mCancelPipe + 1),&local_168);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar2) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xaed,pcVar3);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  uVar1 = ctx.mInterpreter._192_8_;
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_330,"127.0.0.1",&local_331);
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_358);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_378,"1.1",&local_379);
    ot::commissioner::BorderAgent::State::State(&local_380,0,0,0,0,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"net1",&local_3a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c8,"",&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,"",&local_3f1);
    local_400 = (Timestamp)0x0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_420,"",&local_421);
    local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_448);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_468,"domain1",&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_490,"",&local_491);
    ot::commissioner::UnixTime::UnixTime(&local_4a0,0);
    ot::commissioner::BorderAgent::BorderAgent
              (&local_310,&local_330,0x4e21,&local_358,&local_378,local_380,&local_3a0,0,&local_3c8,
               &local_3f0,local_400,0,&local_420,&local_448,&local_468,'\0',0,&local_490,local_4a0,
               0x101f);
    local_191 = ot::commissioner::persistent_storage::Registry::Add((Registry *)uVar1,&local_310);
    local_4a1 = kSuccess;
    testing::internal::EqHelper::
    Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
              ((EqHelper *)local_190,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_191,&local_4a1);
    ot::commissioner::BorderAgent::~BorderAgent(&local_310);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_448);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_358);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar2) {
      testing::Message::Message(&local_4b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xaf1,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_4b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_4b0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    uVar1 = ctx.mInterpreter._192_8_;
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_668,"127.0.0.2",&local_669);
      local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_688);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6a8,"1.1",&local_6a9);
      ot::commissioner::BorderAgent::State::State(&local_6b0,0,0,0,0,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6d0,"net2",&local_6d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6f8,"",&local_6f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_720,"",&local_721);
      local_730 = (Timestamp)0x0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_750,"",&local_751);
      local_778.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_778.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_778.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_778);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_798,"domain2",&local_799);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_7c0,"",&local_7c1);
      ot::commissioner::UnixTime::UnixTime(&local_7d0,0);
      ot::commissioner::BorderAgent::BorderAgent
                (&local_648,&local_668,0x4e22,&local_688,&local_6a8,local_6b0,&local_6d0,1,
                 &local_6f8,&local_720,local_730,0,&local_750,&local_778,&local_798,'\0',0,
                 &local_7c0,local_7d0,0x101f);
      local_4c9 = ot::commissioner::persistent_storage::Registry::Add((Registry *)uVar1,&local_648);
      local_7d1 = kSuccess;
      testing::internal::EqHelper::
      Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
                ((EqHelper *)local_4c8,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_4c9,&local_7d1);
      ot::commissioner::BorderAgent::~BorderAgent(&local_648);
      std::__cxx11::string::~string((string *)&local_7c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
      std::__cxx11::string::~string((string *)&local_798);
      std::allocator<char>::~allocator((allocator<char> *)&local_799);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_778);
      std::__cxx11::string::~string((string *)&local_750);
      std::allocator<char>::~allocator((allocator<char> *)&local_751);
      std::__cxx11::string::~string((string *)&local_720);
      std::allocator<char>::~allocator((allocator<char> *)&local_721);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_688);
      std::__cxx11::string::~string((string *)&local_668);
      std::allocator<char>::~allocator((allocator<char> *)&local_669);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
      if (!bVar2) {
        testing::Message::Message(&local_7e0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xaf5,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_7e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_7e0);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
      uVar1 = ctx.mInterpreter._192_8_;
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_998,"127.0.0.3",&local_999);
        local_9b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_9b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_9b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_9b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_9d8,"1.1",&local_9d9);
        ot::commissioner::BorderAgent::State::State(&local_9e0,0,0,0,0,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a00,"net1",&local_a01);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a28,"",&local_a29);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a50,"",&local_a51);
        local_a60 = (Timestamp)0x0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a80,"",&local_a81);
        local_aa8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_aa8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_aa8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_aa8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_ac8,"domain1",&local_ac9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_af0,"",&local_af1);
        ot::commissioner::UnixTime::UnixTime(&local_b00,0);
        pcVar3 = (char *)(ulong)(uint)local_9e0;
        ot::commissioner::BorderAgent::BorderAgent
                  (&local_978,&local_998,0x4e23,&local_9b8,&local_9d8,local_9e0,&local_a00,0,
                   &local_a28,&local_a50,local_a60,0,&local_a80,&local_aa8,&local_ac8,'\0',0,
                   &local_af0,local_b00,0x101f);
        local_7f9 = ot::commissioner::persistent_storage::Registry::Add
                              ((Registry *)uVar1,&local_978);
        local_b01 = kSuccess;
        testing::internal::EqHelper::
        Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
                  ((EqHelper *)local_7f8,
                   "ctx.mRegistry->Add(BorderAgent{\"127.0.0.3\", 20003, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                   ,"RegistryStatus::kSuccess",&local_7f9,&local_b01);
        ot::commissioner::BorderAgent::~BorderAgent(&local_978);
        std::__cxx11::string::~string((string *)&local_af0);
        std::allocator<char>::~allocator((allocator<char> *)&local_af1);
        std::__cxx11::string::~string((string *)&local_ac8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_aa8);
        std::__cxx11::string::~string((string *)&local_a80);
        std::allocator<char>::~allocator((allocator<char> *)&local_a81);
        std::__cxx11::string::~string((string *)&local_a50);
        std::allocator<char>::~allocator((allocator<char> *)&local_a51);
        std::__cxx11::string::~string((string *)&local_a28);
        std::allocator<char>::~allocator((allocator<char> *)&local_a29);
        std::__cxx11::string::~string((string *)&local_a00);
        std::allocator<char>::~allocator((allocator<char> *)&local_a01);
        std::__cxx11::string::~string((string *)&local_9d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_9b8);
        std::__cxx11::string::~string((string *)&local_998);
        std::allocator<char>::~allocator((allocator<char> *)&local_999);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
        if (!bVar2) {
          testing::Message::Message(&local_b10);
          message = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xaf9,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b10);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::Message::~Message(&local_b10);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&value.mData.field_2 + 8));
          ot::commissioner::Interpreter::Value::Value((Value *)local_b78);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_bb0,"br delete --nwk net1",&local_bb1);
          ot::commissioner::Interpreter::ParseExpression
                    (&local_b90,(Interpreter *)local_140,&local_bb0);
          this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&value.mData.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(this_00,&local_b90);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_b90);
          std::__cxx11::string::~string((string *)&local_bb0);
          std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
          ot::commissioner::Interpreter::Eval
                    ((Value *)&gtest_ar_.message_,(Interpreter *)local_140,this_00);
          ot::commissioner::Interpreter::Value::operator=
                    ((Value *)local_b78,(Value *)&gtest_ar_.message_);
          ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
          local_c11 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_b78);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_c10,&local_c11,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c10);
          if (!bVar2) {
            testing::Message::Message(&local_c20);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)
                       &bra.
                        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_c10,
                       (AssertionResult *)0x46a487,"false","true",pcVar3);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_c28,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xb00,pcVar3);
            testing::internal::AssertHelper::operator=(&local_c28,&local_c20);
            testing::internal::AssertHelper::~AssertHelper(&local_c28);
            std::__cxx11::string::~string
                      ((string *)
                       &bra.
                        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            testing::Message::~Message(&local_c20);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c10);
          std::
          vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ::vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    *)&gtest_ar_4.message_);
          local_c71 = ot::commissioner::persistent_storage::Registry::GetAllBorderRouters
                                ((Registry *)ctx.mInterpreter._192_8_,
                                 (BorderRouterArray *)&gtest_ar_4.message_);
          local_c72 = kSuccess;
          testing::internal::EqHelper::
          Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
                    ((EqHelper *)local_c70,"ctx.mRegistry->GetAllBorderRouters(bra)",
                     "RegistryStatus::kSuccess",&local_c71,&local_c72);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c70);
          if (!bVar2) {
            testing::Message::Message(&local_c80);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c70);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xb02,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_c80);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_c80);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c70);
          local_ca0 = std::
                      vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ::size((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                              *)&gtest_ar_4.message_);
          local_ca4 = 1;
          testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
                    ((EqHelper *)local_c98,"bra.size()","1",&local_ca0,&local_ca4);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c98);
          if (!bVar2) {
            testing::Message::Message(&local_cb0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c98);
            testing::internal::AssertHelper::AssertHelper
                      (&local_cb8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xb03,pcVar3);
            testing::internal::AssertHelper::operator=(&local_cb8,&local_cb0);
            testing::internal::AssertHelper::~AssertHelper(&local_cb8);
            testing::Message::~Message(&local_cb0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c98);
          std::
          vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     *)&gtest_ar_4.message_);
          ot::commissioner::Interpreter::Value::~Value((Value *)local_b78);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&value.mData.field_2 + 8));
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
      }
    }
  }
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrDeleteNetwork)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 0, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.3", 20003, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 0, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("br delete --nwk net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    BorderRouterArray bra;
    EXPECT_EQ(ctx.mRegistry->GetAllBorderRouters(bra), RegistryStatus::kSuccess);
    EXPECT_EQ(bra.size(), 1);
}